

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_verifySolutionReal(SoPlexBase<double> *this)

{
  Verbosity VVar1;
  element_type *peVar2;
  double *in_RDI;
  Real RVar3;
  double *unaff_retaddr;
  SoPlexBase<double> *in_stack_00000008;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  double redcostviol;
  double dualviol;
  double rowviol;
  double boundviol;
  double sumviol;
  Verbosity old_verbosity;
  _func_ostream_ptr_ostream_ptr *in_stack_ffffffffffffff88;
  SPxSolverBase<double> *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  double *in_stack_ffffffffffffffa0;
  SoPlexBase<double> *in_stack_ffffffffffffffa8;
  double dVar4;
  Verbosity in_stack_ffffffffffffffb8;
  Verbosity in_stack_ffffffffffffffbc;
  Verbosity in_stack_ffffffffffffffc0;
  Verbosity in_stack_ffffffffffffffc4;
  SPxSolverBase<double> *pSVar5;
  Verbosity local_10;
  Verbosity local_c;
  double *sumviol_00;
  
  sumviol_00 = in_RDI;
  if ((in_RDI != (double *)0xfffffffffffffff8) &&
     (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 1)), 2 < (int)VVar1)) {
    local_c = SPxOut::getVerbosity((SPxOut *)(in_RDI + 1));
    local_10 = INFO1;
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 1),&local_10);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 1),&local_c);
  }
  pSVar5 = (SPxSolverBase<double> *)0x0;
  getBoundViolation((SoPlexBase<double> *)0x0,
                    (double *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  getRowViolation(in_stack_00000008,unaff_retaddr,sumviol_00);
  getDualViolation(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  getRedCostViolation(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98)
  ;
  dVar4 = 0.0;
  SPxSolverBase<double>::tolerances((SPxSolverBase<double> *)(in_RDI + 0x30));
  peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x423f1e);
  RVar3 = Tolerances::floatingPointFeastol(peVar2);
  if (dVar4 < RVar3) {
    dVar4 = 0.0;
    SPxSolverBase<double>::tolerances((SPxSolverBase<double> *)(in_RDI + 0x30));
    peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x423f5e);
    RVar3 = Tolerances::floatingPointFeastol(peVar2);
    if (dVar4 < RVar3) {
      dVar4 = 0.0;
      SPxSolverBase<double>::tolerances((SPxSolverBase<double> *)(in_RDI + 0x30));
      peVar2 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x423f9a);
      RVar3 = Tolerances::floatingPointOpttol(peVar2);
      if (dVar4 < RVar3) {
        SPxSolverBase<double>::tolerances((SPxSolverBase<double> *)(in_RDI + 0x30));
        peVar2 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x423fd6);
        RVar3 = Tolerances::floatingPointOpttol(peVar2);
        in_stack_ffffffffffffff90 = pSVar5;
        if ((double)pSVar5 < RVar3) {
          return;
        }
      }
    }
  }
  if ((in_RDI != (double *)0xfffffffffffffff8) &&
     (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 1)), 4 < (int)VVar1)) {
    SPxOut::getVerbosity((SPxOut *)(in_RDI + 1));
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 1),(Verbosity *)&stack0xffffffffffffffc0);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 1),(Verbosity *)&stack0xffffffffffffffc4);
  }
  if ((in_RDI != (double *)0xfffffffffffffff8) &&
     (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 1)), 2 < (int)VVar1)) {
    SPxOut::getVerbosity((SPxOut *)(in_RDI + 1));
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 1),(Verbosity *)&stack0xffffffffffffffb8);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 1),(Verbosity *)&stack0xffffffffffffffbc);
  }
  if ((*(byte *)((long)in_RDI + 0x4379) & 1) != 0) {
    SPxSolverBase<double>::unscaleLPandReloadBasis(in_stack_ffffffffffffff90);
    *(undefined1 *)((long)in_RDI + 0x4379) = 0;
    *(int *)(in_RDI + 0xa1b) = *(int *)(in_RDI + 0xa1b) + 1;
  }
  _preprocessAndSolveReal((SoPlexBase<double> *)rowviol,dualviol._7_1_,(bool *)redcostviol);
  return;
}

Assistant:

void SoPlexBase<R>::_verifySolutionReal()
{
   assert(_hasSolReal);

   SPX_MSG_INFO1(spxout, spxout << " --- verifying computed solution" << std::endl;)

   R sumviol = 0;
   R boundviol = 0;
   R rowviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   (void) getBoundViolation(boundviol, sumviol);
   (void) getRowViolation(rowviol, sumviol);
   (void) getDualViolation(dualviol, sumviol);
   (void) getRedCostViolation(redcostviol, sumviol);

   if(boundviol >= _solver.tolerances()->floatingPointFeastol()
         || rowviol >= _solver.tolerances()->floatingPointFeastol()
         || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << "bound violation: " << boundviol
                    << ", row violation: " << rowviol
                    << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}